

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cpp
# Opt level: O0

Matrix * Matrix::multiply(Matrix *m1,Matrix *m2)

{
  ostream *this;
  ulong local_58;
  size_t k;
  double sum;
  size_t j;
  size_t i;
  Matrix *matrix;
  Matrix *m2_local;
  Matrix *m1_local;
  
  if (m1->rows == m2->cols) {
    m1_local = (Matrix *)operator_new(0x18);
    Matrix(m1_local,m1->rows,m2->cols,false);
    for (j = 0; j < m1_local->rows; j = j + 1) {
      for (sum = 0.0; (ulong)sum < m1_local->cols; sum = (double)((long)sum + 1)) {
        k = 0;
        for (local_58 = 0; local_58 < m1->cols; local_58 = local_58 + 1) {
          k = (size_t)(m1->data[j * m1->cols + local_58] * m2->data[local_58 * m2->cols + (long)sum]
                      + (double)k);
        }
        m1_local->data[j * m1_local->cols + (long)sum] = (double)k;
      }
    }
  }
  else {
    this = std::operator<<((ostream *)&std::cout,"Parameter 1 ROWS don\'t match Parameter 2 COLS");
    std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
    m1_local = (Matrix *)0x0;
  }
  return m1_local;
}

Assistant:

Matrix* Matrix::multiply(Matrix* m1, Matrix* m2) {
	if (m1->rows != m2->cols) {
		std::cout << "Parameter 1 ROWS don't match Parameter 2 COLS" << std::endl;
		return nullptr;
	}

	Matrix* matrix = new Matrix(m1->rows, m2->cols);
	for (size_t i = 0; i < matrix->rows; i++) {
		for (size_t j = 0; j < matrix->cols; j++) {
			double sum = 0;
			for (size_t k = 0; k < m1->cols; k++) {
				sum += m1->data[i * m1->cols + k] * m2->data[k * m2->cols + j];
			}
			matrix->data[i * matrix->cols + j] = sum;
		}
	}
	return matrix;
}